

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int cvSensAllocVectors(CVodeMem cv_mem,N_Vector tmpl)

{
  int iVar1;
  int iVar2;
  N_Vector *pp_Var3;
  sunrealtype *psVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  pp_Var3 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns);
  cv_mem->cv_yS = pp_Var3;
  if (pp_Var3 != (N_Vector *)0x0) {
    pp_Var3 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,tmpl);
    cv_mem->cv_ewtS = pp_Var3;
    if (pp_Var3 == (N_Vector *)0x0) {
      pp_Var3 = cv_mem->cv_yS;
    }
    else {
      pp_Var3 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,tmpl);
      cv_mem->cv_acorS = pp_Var3;
      if (pp_Var3 == (N_Vector *)0x0) {
        N_VDestroyVectorArray(cv_mem->cv_yS,cv_mem->cv_Ns);
        pp_Var3 = cv_mem->cv_ewtS;
      }
      else {
        pp_Var3 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,tmpl);
        cv_mem->cv_tempvS = pp_Var3;
        if (pp_Var3 == (N_Vector *)0x0) {
          N_VDestroyVectorArray(cv_mem->cv_yS,cv_mem->cv_Ns);
          N_VDestroyVectorArray(cv_mem->cv_ewtS,cv_mem->cv_Ns);
          pp_Var3 = cv_mem->cv_acorS;
        }
        else {
          pp_Var3 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,tmpl);
          cv_mem->cv_ftempS = pp_Var3;
          if (pp_Var3 != (N_Vector *)0x0) {
            for (lVar6 = 0; iVar1 = cv_mem->cv_qmax, lVar6 <= iVar1; lVar6 = lVar6 + 1) {
              pp_Var3 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,tmpl);
              cv_mem->cv_znS[lVar6] = pp_Var3;
              if (pp_Var3 == (N_Vector *)0x0) {
                N_VDestroyVectorArray(cv_mem->cv_yS,cv_mem->cv_Ns);
                N_VDestroyVectorArray(cv_mem->cv_ewtS,cv_mem->cv_Ns);
                N_VDestroyVectorArray(cv_mem->cv_acorS,cv_mem->cv_Ns);
                N_VDestroyVectorArray(cv_mem->cv_tempvS,cv_mem->cv_Ns);
                N_VDestroyVectorArray(cv_mem->cv_ftempS,cv_mem->cv_Ns);
                for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
                  N_VDestroyVectorArray(cv_mem->cv_znS[lVar7],cv_mem->cv_Ns);
                }
                return 0;
              }
            }
            iVar2 = cv_mem->cv_Ns;
            lVar6 = (long)iVar2;
            psVar4 = (sunrealtype *)malloc(lVar6 * 8);
            cv_mem->cv_pbar = psVar4;
            if (psVar4 != (sunrealtype *)0x0) {
              piVar5 = (int *)malloc(lVar6 * 4);
              cv_mem->cv_plist = piVar5;
              if (piVar5 != (int *)0x0) {
                lVar7 = (long)((iVar1 + 6) * iVar2);
                cv_mem->cv_lrw = cv_mem->cv_lrw + cv_mem->cv_lrw1 * lVar7 + lVar6;
                cv_mem->cv_liw = cv_mem->cv_liw + lVar7 * cv_mem->cv_liw1 + lVar6;
                cv_mem->cv_qmax_allocS = iVar1;
                return 1;
              }
              N_VDestroyVectorArray(cv_mem->cv_yS,iVar2);
              N_VDestroyVectorArray(cv_mem->cv_ewtS,cv_mem->cv_Ns);
              N_VDestroyVectorArray(cv_mem->cv_acorS,cv_mem->cv_Ns);
              N_VDestroyVectorArray(cv_mem->cv_tempvS,cv_mem->cv_Ns);
              N_VDestroyVectorArray(cv_mem->cv_ftempS,cv_mem->cv_Ns);
              for (lVar6 = 0; lVar6 <= cv_mem->cv_qmax; lVar6 = lVar6 + 1) {
                N_VDestroyVectorArray(cv_mem->cv_znS[lVar6],cv_mem->cv_Ns);
              }
              free(cv_mem->cv_pbar);
              cv_mem->cv_pbar = (sunrealtype *)0x0;
              return 0;
            }
            N_VDestroyVectorArray(cv_mem->cv_yS,iVar2);
            N_VDestroyVectorArray(cv_mem->cv_ewtS,cv_mem->cv_Ns);
            N_VDestroyVectorArray(cv_mem->cv_acorS,cv_mem->cv_Ns);
            N_VDestroyVectorArray(cv_mem->cv_tempvS,cv_mem->cv_Ns);
            N_VDestroyVectorArray(cv_mem->cv_ftempS,cv_mem->cv_Ns);
            for (lVar6 = 0; lVar6 <= cv_mem->cv_qmax; lVar6 = lVar6 + 1) {
              N_VDestroyVectorArray(cv_mem->cv_znS[lVar6],cv_mem->cv_Ns);
            }
            return 0;
          }
          N_VDestroyVectorArray(cv_mem->cv_yS,cv_mem->cv_Ns);
          N_VDestroyVectorArray(cv_mem->cv_ewtS,cv_mem->cv_Ns);
          N_VDestroyVectorArray(cv_mem->cv_acorS,cv_mem->cv_Ns);
          pp_Var3 = cv_mem->cv_tempvS;
        }
      }
    }
    N_VDestroyVectorArray(pp_Var3,cv_mem->cv_Ns);
  }
  return 0;
}

Assistant:

static sunbooleantype cvSensAllocVectors(CVodeMem cv_mem, N_Vector tmpl)
{
  int i, j;

  /* Allocate yS */
  cv_mem->cv_yS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_yS == NULL) { return (SUNFALSE); }

  /* Allocate ewtS */
  cv_mem->cv_ewtS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_ewtS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate acorS */
  cv_mem->cv_acorS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_acorS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate tempvS */
  cv_mem->cv_tempvS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_tempvS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate ftempS */
  cv_mem->cv_ftempS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_ftempS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate znS */
  for (j = 0; j <= cv_mem->cv_qmax; j++)
  {
    cv_mem->cv_znS[j] = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
    if (cv_mem->cv_znS[j] == NULL)
    {
      N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);
      for (i = 0; i < j; i++)
      {
        N_VDestroyVectorArray(cv_mem->cv_znS[i], cv_mem->cv_Ns);
      }
      return (SUNFALSE);
    }
  }

  /* Allocate space for pbar and plist */
  cv_mem->cv_pbar = NULL;
  cv_mem->cv_pbar = (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
  if (cv_mem->cv_pbar == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);
    for (i = 0; i <= cv_mem->cv_qmax; i++)
    {
      N_VDestroyVectorArray(cv_mem->cv_znS[i], cv_mem->cv_Ns);
    }
    return (SUNFALSE);
  }

  cv_mem->cv_plist = NULL;
  cv_mem->cv_plist = (int*)malloc(cv_mem->cv_Ns * sizeof(int));
  if (cv_mem->cv_plist == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);
    for (i = 0; i <= cv_mem->cv_qmax; i++)
    {
      N_VDestroyVectorArray(cv_mem->cv_znS[i], cv_mem->cv_Ns);
    }
    free(cv_mem->cv_pbar);
    cv_mem->cv_pbar = NULL;
    return (SUNFALSE);
  }

  /* Update solver workspace lengths */
  cv_mem->cv_lrw += (cv_mem->cv_qmax + 6) * cv_mem->cv_Ns * cv_mem->cv_lrw1 +
                    cv_mem->cv_Ns;
  cv_mem->cv_liw += (cv_mem->cv_qmax + 6) * cv_mem->cv_Ns * cv_mem->cv_liw1 +
                    cv_mem->cv_Ns;

  /* Store the value of qmax used here */
  cv_mem->cv_qmax_allocS = cv_mem->cv_qmax;

  return (SUNTRUE);
}